

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O1

void __thiscall
boost::exception_detail::
clone_impl<boost::exception_detail::error_info_injector<boost::bad_function_call>_>::clone_impl
          (clone_impl<boost::exception_detail::error_info_injector<boost::bad_function_call>_> *this
          ,runtime_error *x)

{
  error_info_container *peVar1;
  char *pcVar2;
  
  *(undefined ***)&this->field_0x38 = &PTR___cxa_pure_virtual_001cd0a0;
  std::runtime_error::runtime_error((runtime_error *)this,x);
  *(undefined ***)
   &(this->super_error_info_injector<boost::bad_function_call>).super_bad_function_call =
       &PTR__runtime_error_001cd118;
  (this->super_error_info_injector<boost::bad_function_call>).super_exception._vptr_exception =
       (_func_int **)&PTR___cxa_pure_virtual_001cd140;
  peVar1 = *(error_info_container **)(x + 0x18);
  (this->super_error_info_injector<boost::bad_function_call>).super_exception.data_.px_ = peVar1;
  if (peVar1 != (error_info_container *)0x0) {
    (**(code **)(*(long *)peVar1 + 0x18))();
  }
  (this->super_error_info_injector<boost::bad_function_call>).super_exception.throw_line_ =
       *(int *)(x + 0x30);
  pcVar2 = *(char **)(x + 0x28);
  (this->super_error_info_injector<boost::bad_function_call>).super_exception.throw_function_ =
       *(char **)(x + 0x20);
  (this->super_error_info_injector<boost::bad_function_call>).super_exception.throw_file_ = pcVar2;
  *(undefined8 *)
   &(this->super_error_info_injector<boost::bad_function_call>).super_bad_function_call = 0x1cd000;
  (this->super_error_info_injector<boost::bad_function_call>).super_exception._vptr_exception =
       (_func_int **)0x1cd038;
  *(undefined8 *)&this->field_0x38 = 0x1cd070;
  copy_boost_exception
            (&(this->super_error_info_injector<boost::bad_function_call>).super_exception,
             (exception *)(x + 0x10));
  return;
}

Assistant:

clone_impl( clone_impl const & x, clone_tag ):
                T(x)
                {
                copy_boost_exception(this,&x);
                }